

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*>::
emplace_back<slang::syntax::ConfigInstanceIdentifierSyntax*>
          (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *this,
          ConfigInstanceIdentifierSyntax **args)

{
  long lVar1;
  reference ppCVar2;
  pointer ppCVar3;
  
  lVar1 = *(long *)(this + 8);
  ppCVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppCVar3 = emplaceRealloc<slang::syntax::ConfigInstanceIdentifierSyntax*>(this,ppCVar3,args);
    return ppCVar3;
  }
  *ppCVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppCVar2 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::back
                      ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
  return ppCVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }